

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

int Abc_TtScc6(word wTruth,int ck)

{
  int iVar1;
  int local_24;
  int ci;
  int sum;
  int i;
  int ck_local;
  word wTruth_local;
  
  local_24 = 0;
  if (wTruth == 0) {
    wTruth_local._4_4_ = 0;
  }
  else {
    for (ci = 0; ci < 0x40; ci = ci + 1) {
      if ((wTruth & 1L << ((byte)ci & 0x3f)) != 0) {
        iVar1 = shiftFunc(Abc_TtBitCount8[ci] + ck);
        local_24 = iVar1 + local_24;
      }
    }
    wTruth_local._4_4_ = local_24;
  }
  return wTruth_local._4_4_;
}

Assistant:

static int Abc_TtScc6(word wTruth, int ck)
{
    int i;
    int sum = 0;
    if (!wTruth) return 0;
    for (i = 0; i < 64; i++)
        if (wTruth & (word)1 << i) {
            int ci = Abc_TtBitCount8[i] + ck;
            sum += shiftFunc(ci);
        }
    return sum;
}